

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::TrustTokenMetadataTest_ExcessDataProof_Test::TestBody
          (TrustTokenMetadataTest_ExcessDataProof_Test *this)

{
  uint32_t public_metadata;
  TRUST_TOKEN_ISSUER *ctx;
  TRUST_TOKEN_METHOD *pTVar1;
  TRUST_TOKEN_METHOD *pTVar2;
  uint8_t *request;
  bool bVar3;
  int iVar4;
  ParamType *pPVar5;
  TRUST_TOKEN_METHOD *pTVar6;
  TRUST_TOKEN_METHOD *pTVar7;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_R9;
  char *pcVar8;
  size_t len;
  ulong uVar9;
  AssertionResult gtest_ar__11;
  uint8_t *bad_buf;
  size_t bad_len;
  CBS tmp;
  AssertionResult gtest_ar__3;
  uint16_t count;
  CBS real_response;
  CBB dleq;
  UniquePtr<uint8_t> free_bad;
  size_t key_index;
  ScopedCBB bad_response;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  uint8_t *issue_msg;
  uint32_t parsed_public_metadata;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  UniquePtr<uint8_t> free_msg;
  UniquePtr<uint8_t> free_issue_msg;
  size_t msg_len;
  uint8_t *issue_resp;
  size_t resp_len;
  size_t tokens_issued;
  
  if ((((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_)->
       has_private_metadata == 0) &&
     (pPVar5 = testing::
               WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>::
               GetParam(),
     (pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>).
     super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
     super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl != false)) {
    return;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) {
LAB_00337712:
    testing::Message::Message((Message *)&bad_response);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dleq,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x45e,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&dleq,(Message *)&bad_response);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dleq);
    if (bad_response.ctx_.child != (CBB *)0x0) {
      (**(code **)&(bad_response.ctx_.child)->child->is_child)();
    }
    return;
  }
  testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)&bad_response);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
  }
  testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)&bad_response);
  if (bad_response.ctx_.is_child == '\x01') goto LAB_00337712;
  issue_msg = (uint8_t *)0x0;
  issue_resp = (uint8_t *)0x0;
  if ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.use_msg_ == true) {
    pcVar8 = &DAT_00000004;
    iVar4 = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                      ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10,"MSG",4);
    dleq.is_child = '\0';
    dleq._9_7_ = 0;
    dleq.child._0_1_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&bad_response,(internal *)&dleq,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                 ,"false","true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&real_response,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x464,(char *)bad_response.ctx_.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&real_response,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&real_response);
      std::__cxx11::string::~string((string *)&bad_response);
      if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
      }
LAB_00337b92:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&dleq.is_child);
      return;
    }
  }
  else {
    iVar4 = TRUST_TOKEN_CLIENT_begin_issuance
                      ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10);
    dleq.is_child = '\0';
    dleq._9_7_ = 0;
    dleq.child._0_1_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&bad_response,(internal *)&dleq,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&real_response,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x467,(char *)bad_response.ctx_.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&real_response,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&real_response);
      std::__cxx11::string::~string((string *)&bad_response);
      if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
      }
      goto LAB_00337b92;
    }
  }
  dleq.is_child = '\0';
  dleq._9_7_ = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dleq.is_child);
  request = issue_msg;
  free_issue_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_msg;
  ctx = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.issuer._M_t.
        super___uniq_ptr_impl<trust_token_issuer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_trust_token_issuer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_trust_token_issuer_st_*,_false>._M_head_impl;
  pPVar5 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
           ::GetParam();
  public_metadata =
       (pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>).
       super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
       super__Head_base<2UL,_int,_false>._M_head_impl;
  pPVar5 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
           ::GetParam();
  iVar4 = TRUST_TOKEN_ISSUER_issue
                    (ctx,&issue_resp,&resp_len,&tokens_issued,request,msg_len,public_metadata,
                     (pPVar5->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>
                     ).super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
                     super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl,1)
  ;
  dleq.is_child = '\0';
  dleq._9_7_ = 0;
  dleq.child._0_1_ = iVar4 != 0;
  if (iVar4 == 0) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bad_response,(internal *)&dleq,
               (AssertionResult *)
               "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, public_metadata(), private_metadata(), 1)"
               ,"false","true",(char *)msg_len);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&real_response,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x46d,(char *)bad_response.ctx_.child);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&real_response,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&real_response);
    std::__cxx11::string::~string((string *)&bad_response);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dleq.is_child);
    goto LAB_0033851a;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dleq.is_child);
  free_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_resp;
  real_response.data = issue_resp;
  real_response.len = resp_len;
  CBB_zero(&bad_response.ctx_);
  iVar4 = CBB_init(&bad_response.ctx_,0);
  this_00 = &gtest_ar__3.message_;
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__3.success_ = iVar4 != 0;
  if (iVar4 == 0) {
    testing::Message::Message((Message *)&tmp);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&dleq,(internal *)&gtest_ar__3,
               (AssertionResult *)"CBB_init(bad_response.get(), 0)","false","true",(char *)msg_len);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x475,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
    std::__cxx11::string::~string((string *)&dleq);
    if (tmp.data != (uint8_t *)0x0) {
      (**(code **)(*(long *)tmp.data + 8))();
    }
LAB_003384fb:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBS_get_u16(&real_response,&count);
    this_00 = &gtest_ar__3.message_;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBS_get_u16(&real_response, &count)","false","true",
                 (char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x476,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      std::__cxx11::string::~string((string *)&dleq);
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_add_u16(&bad_response.ctx_,count);
    this_00 = &gtest_ar__3.message_;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBB_add_u16(bad_response.get(), count)","false","true",
                 (char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x477,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      std::__cxx11::string::~string((string *)&dleq);
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBS_get_u32(&real_response,&parsed_public_metadata);
    this_00 = &gtest_ar__3.message_;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBS_get_u32(&real_response, &parsed_public_metadata)","false",
                 "true",(char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x478,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      std::__cxx11::string::~string((string *)&dleq);
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_add_u32(&bad_response.ctx_,parsed_public_metadata);
    this_00 = &gtest_ar__3.message_;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&tmp);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBB_add_u32(bad_response.get(), parsed_public_metadata)",
                 "false","true",(char *)msg_len);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x479,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
      std::__cxx11::string::~string((string *)&dleq);
      if (tmp.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)tmp.data + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    pTVar1 = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_;
    pTVar6 = TRUST_TOKEN_experiment_v1();
    pTVar2 = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_;
    pTVar7 = TRUST_TOKEN_experiment_v2_voprf();
    if ((pTVar2 == pTVar7) ||
       (pTVar2 = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_,
       pTVar7 = TRUST_TOKEN_pst_v1_voprf(), pTVar2 == pTVar7)) {
      len = 0x61;
      pcVar8 = (char *)msg_len;
    }
    else {
      len = (ulong)(pTVar1 == pTVar6) * 4 + 0x102;
      pcVar8 = (char *)msg_len;
    }
    this_00 = &gtest_ar__3.message_;
    for (uVar9 = 0; uVar9 < count; uVar9 = uVar9 + 1) {
      iVar4 = CBB_add_bytes(&bad_response.ctx_,real_response.data,len);
      gtest_ar__3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__3.success_ = iVar4 != 0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&tmp);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&dleq,(internal *)&gtest_ar__3,
                   (AssertionResult *)
                   "CBB_add_bytes(bad_response.get(), CBS_data(&real_response), token_length)",
                   "false","true",pcVar8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                   ,0x486,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
        std::__cxx11::string::~string((string *)&dleq);
        if (tmp.data != (uint8_t *)0x0) {
          (**(code **)(*(long *)tmp.data + 8))();
        }
        goto LAB_003384fb;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      iVar4 = CBS_skip(&real_response,len);
      gtest_ar__3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__3.success_ = iVar4 != 0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&tmp);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&dleq,(internal *)&gtest_ar__3,
                   (AssertionResult *)"CBS_skip(&real_response, token_length)","false","true",pcVar8
                  );
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                   ,0x487,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11,(Message *)&tmp);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
        std::__cxx11::string::~string((string *)&dleq);
        if (tmp.data != (uint8_t *)0x0) {
          (**(code **)(*(long *)tmp.data + 8))();
        }
        this_00 = &gtest_ar__3.message_;
        goto LAB_003384fb;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
    }
    iVar4 = CBS_get_u16_length_prefixed(&real_response,&tmp);
    this_00 = &gtest_ar__3.message_;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&gtest_ar__11);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&dleq,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBS_get_u16_length_prefixed(&real_response, &tmp)","false",
                 "true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_buf,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48b,(char *)CONCAT71(dleq.child._1_7_,dleq.child._0_1_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_buf,(Message *)&gtest_ar__11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_buf);
      std::__cxx11::string::~string((string *)&dleq);
      if ((long *)CONCAT71(gtest_ar__11._1_7_,gtest_ar__11.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__11._1_7_,gtest_ar__11.success_) + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_add_u16_length_prefixed(&bad_response.ctx_,&dleq);
    this_00 = &gtest_ar__11.message_;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__11.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_add_u16_length_prefixed(bad_response.get(), &dleq)","false"
                 ,"true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48d,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      std::__cxx11::string::~string((string *)&gtest_ar__3);
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_add_bytes(&dleq,tmp.data,tmp.len);
    this_00 = &gtest_ar__11.message_;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__11.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_add_bytes(&dleq, CBS_data(&tmp), CBS_len(&tmp))","false",
                 "true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48e,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      std::__cxx11::string::~string((string *)&gtest_ar__3);
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_add_u16(&dleq,0x2a);
    this_00 = &gtest_ar__11.message_;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__11.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_add_u16(&dleq, 42)","false","true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x48f,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      std::__cxx11::string::~string((string *)&gtest_ar__3);
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_flush(&bad_response.ctx_);
    this_00 = &gtest_ar__11.message_;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__11.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&bad_buf);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_flush(bad_response.get())","false","true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bad_len,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x490,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&bad_len,(Message *)&bad_buf);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bad_len);
      std::__cxx11::string::~string((string *)&gtest_ar__3);
      if (bad_buf != (uint8_t *)0x0) {
        (**(code **)(*(long *)bad_buf + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    iVar4 = CBB_finish(&bad_response.ctx_,&bad_buf,&bad_len);
    this_00 = &gtest_ar__11.message_;
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__11.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&free_bad);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,
                 (AssertionResult *)"CBB_finish(bad_response.get(), &bad_buf, &bad_len)","false",
                 "true",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&key_index,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x494,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&key_index,(Message *)&free_bad);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_index);
      std::__cxx11::string::~string((string *)&gtest_ar__3);
      if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
          free_bad._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)free_bad._M_t.
                              super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
      }
      goto LAB_003384fb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    free_bad._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)bad_buf;
    tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_TRUST_TOKEN,_bssl::internal::Deleter,_true,_true>)
         TRUST_TOKEN_CLIENT_finish_issuance
                   ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                    _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,&key_index,
                    bad_buf,bad_len);
    gtest_ar__11.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__11.success_ =
         (tuple<stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>)
         tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl ==
         (_Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>)0x0;
    if (!gtest_ar__11.success_) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3,(internal *)&gtest_ar__11,(AssertionResult *)"tokens","true"
                 ,"false",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x49b,(char *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_));
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      std::__cxx11::string::~string((string *)&gtest_ar__3);
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__11.message_);
    std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr(&tokens);
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_bad);
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&bad_response);
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_msg);
LAB_0033851a:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_issue_msg);
  return;
}

Assistant:

TEST_P(TrustTokenMetadataTest, ExcessDataProof) {
  if (!method()->has_private_metadata && private_metadata()) {
    return;
  }

  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);
  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      public_metadata(), private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);

  CBS real_response;
  CBS_init(&real_response, issue_resp, resp_len);
  uint16_t count;
  uint32_t parsed_public_metadata;
  bssl::ScopedCBB bad_response;
  ASSERT_TRUE(CBB_init(bad_response.get(), 0));
  ASSERT_TRUE(CBS_get_u16(&real_response, &count));
  ASSERT_TRUE(CBB_add_u16(bad_response.get(), count));
  ASSERT_TRUE(CBS_get_u32(&real_response, &parsed_public_metadata));
  ASSERT_TRUE(CBB_add_u32(bad_response.get(), parsed_public_metadata));

  const size_t kP384PointLen = 1 + 2 * (384 / 8);
  size_t token_length = TRUST_TOKEN_NONCE_SIZE + 2 * kP384PointLen;
  if (method() == TRUST_TOKEN_experiment_v1()) {
    token_length += 4;
  }
  if (method() == TRUST_TOKEN_experiment_v2_voprf() ||
      method() == TRUST_TOKEN_pst_v1_voprf()) {
    token_length = kP384PointLen;
  }
  for (size_t i = 0; i < count; i++) {
    ASSERT_TRUE(CBB_add_bytes(bad_response.get(), CBS_data(&real_response),
                              token_length));
    ASSERT_TRUE(CBS_skip(&real_response, token_length));
  }

  CBS tmp;
  ASSERT_TRUE(CBS_get_u16_length_prefixed(&real_response, &tmp));
  CBB dleq;
  ASSERT_TRUE(CBB_add_u16_length_prefixed(bad_response.get(), &dleq));
  ASSERT_TRUE(CBB_add_bytes(&dleq, CBS_data(&tmp), CBS_len(&tmp)));
  ASSERT_TRUE(CBB_add_u16(&dleq, 42));
  ASSERT_TRUE(CBB_flush(bad_response.get()));

  uint8_t *bad_buf;
  size_t bad_len;
  ASSERT_TRUE(CBB_finish(bad_response.get(), &bad_buf, &bad_len));
  bssl::UniquePtr<uint8_t> free_bad(bad_buf);

  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, bad_buf,
                                         bad_len));
  ASSERT_FALSE(tokens);
}